

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fnameSessions;
  Session session;
  allocator<char> local_89;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Session local_48;
  
  printf("Usage: %s session0.imdd [session1.imdd] [session2.imdd] [...]\n",*argv);
  iVar3 = -1;
  if (1 < argc) {
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar2 = 1;
    do {
      printf("[+] Session \'%s\' info:\n",argv[uVar2]);
      local_48.frames.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.frames.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.frames.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar1 = Session::load(&local_48,argv[uVar2]);
      if (bVar1) {
        Session::printInfo(&local_48);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,argv[uVar2],&local_89);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                   &local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        main_cold_1();
      }
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::~vector(&local_48.frames);
      uVar2 = uVar2 + 1;
    } while ((uint)argc != uVar2);
    putchar(10);
    if (local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      main_cold_2();
      iVar3 = -1;
    }
    else {
      ImGui::DebugCheckVersionAndDataLayout("1.88 WIP",0x37d0,0x418,8,0x10,0x14,2);
      ImGui::CreateContext((ImFontAtlas *)0x0);
      benchmark<ImDrawDataCompressor::XorRlePerDrawList>(&local_88);
      benchmark<ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset>(&local_88);
      iVar3 = 0;
      ImGui::DestroyContext((ImGuiContext *)0x0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
  }
  return iVar3;
}

Assistant:

int main(int argc , char ** argv) {
    printf("Usage: %s session0.imdd [session1.imdd] [session2.imdd] [...]\n", argv[0]);

    if (argc < 2) {
        return -1;
    }

    std::vector<std::string> fnameSessions;

    for (int i = 1; i < argc; ++i) {
        printf("[+] Session '%s' info:\n", argv[i]);
        Session session;
        if (session.load(argv[i]) == false) {
            fprintf(stderr, "    [E] Failed reading the file. Probably not an ImDrawData session file?\n");
        } else {
            session.printInfo();
            fnameSessions.push_back(argv[i]);
        }
    }
    printf("\n");

    if (fnameSessions.size() == 0) {
        fprintf(stderr, "[E] No valid files provided - nothing to do\n");
        return -1;
    }

    IMGUI_CHECKVERSION();
    ImGui::CreateContext();

    benchmark<ImDrawDataCompressor::XorRlePerDrawList>(fnameSessions);
    benchmark<ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset>(fnameSessions);

    ImGui::DestroyContext();

    return 0;
}